

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

void __thiscall
Fad<double>::
Fad<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
          (Fad<double> *this,
          FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar4;
  Fad<double> *pFVar5;
  Fad<double> *pFVar6;
  Fad<double> *pFVar7;
  Fad<double> *pFVar8;
  uint uVar9;
  double *pdVar10;
  ulong uVar11;
  value_type vVar12;
  
  pFVar3 = (fadexpr->fadexpr_).left_;
  pFVar4 = (fadexpr->fadexpr_).right_;
  pFVar5 = (pFVar3->fadexpr_).left_;
  pFVar6 = (pFVar3->fadexpr_).right_;
  pFVar7 = (pFVar4->fadexpr_).left_;
  pFVar8 = (pFVar4->fadexpr_).right_;
  this->val_ = pFVar7->val_ * pFVar8->val_ + pFVar5->val_ * pFVar6->val_;
  uVar1 = (pFVar5->dx_).num_elts;
  uVar2 = (pFVar6->dx_).num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (pFVar7->dx_).num_elts;
  uVar9 = (pFVar8->dx_).num_elts;
  if ((int)uVar9 < (int)uVar1) {
    uVar9 = uVar1;
  }
  if ((int)uVar9 < (int)uVar2) {
    uVar9 = uVar2;
  }
  (this->dx_).num_elts = 0;
  (this->dx_).ptr_to_data = (double *)0x0;
  if (0 < (int)uVar9) {
    (this->dx_).num_elts = uVar9;
    pdVar10 = (double *)operator_new__((ulong)uVar9 << 3);
    (this->dx_).ptr_to_data = pdVar10;
  }
  this->defaultVal = 0.0;
  uVar1 = (((pFVar3->fadexpr_).left_)->dx_).num_elts;
  uVar2 = (((pFVar3->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (((pFVar4->fadexpr_).left_)->dx_).num_elts;
  uVar9 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar9 < (int)uVar1) {
    uVar9 = uVar1;
  }
  if ((int)uVar9 < (int)uVar2) {
    uVar9 = uVar2;
  }
  if (0 < (int)uVar9) {
    uVar11 = 0;
    do {
      vVar12 = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
               ::dx(&fadexpr->fadexpr_,(int)uVar11);
      (this->dx_).ptr_to_data[uVar11] = vVar12;
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }